

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend.hpp
# Opt level: O1

int __thiscall BCL::init(BCL *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  string *psVar1;
  int nprocs;
  int rank;
  int local_44;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  comm = &ompi_mpi_comm_world;
  shared_segment_size = (long)this << 0x14;
  MPI_Initialized(&local_40);
  if ((int)local_40 == 0) {
    if ((char)ctx == '\0') {
      MPI_Init(0,0);
    }
    else {
      MPI_Init_thread(0,0,3,&local_44);
      if (local_44 < 3) {
        psVar1 = (string *)__cxa_allocate_exception(0x20);
        local_40 = local_30;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,
                   "BCL Asked for MPI_THREAD_MULTIPLE, but was denied. You need a thread-safe MPI implementation."
                   ,"");
        *(string **)psVar1 = psVar1 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar1,local_40,local_40 + local_38);
        __cxa_throw(psVar1,&error::typeinfo,error::~error);
      }
    }
    we_initialized = 1;
  }
  MPI_Comm_rank(comm,&local_40);
  MPI_Comm_size(comm,&local_44);
  my_rank = (long)(int)local_40;
  my_nprocs = (long)local_44;
  MPI_Info_create(&info);
  MPI_Info_set(info,"accumulate_ordering","none");
  MPI_Info_set(info,"accumulate_ops","same_op_no_op");
  MPI_Info_set(info,"same_size","true");
  MPI_Info_set(info,"same_disp_unit","true");
  MPI_Win_allocate(shared_segment_size,1,info,comm,&smem_base_ptr,&win);
  bcl_finalized = 0;
  smem_heap = smem_base_ptr + 0x40;
  flist = 0;
  MPI_Barrier(comm);
  MPI_Win_lock_all(0,win);
  barrier();
  return extraout_EAX;
}

Assistant:

void init(uint64_t shared_segment_size = 256, bool thread_safe = false) {
  BCL::comm = MPI_COMM_WORLD;
  BCL::shared_segment_size = 1024*1024*shared_segment_size;

  if (!mpi_initialized()) {
    if (!thread_safe) {
      MPI_Init(NULL, NULL);
    } else {
      int provided;
      MPI_Init_thread(NULL, NULL, MPI_THREAD_MULTIPLE, &provided);
      if (provided < MPI_THREAD_MULTIPLE) {
        throw BCL::error("BCL Asked for MPI_THREAD_MULTIPLE, but was denied. "
                         "You need a thread-safe MPI implementation.");
      }
    }
    we_initialized = true;
  }

  int rank, nprocs;
  MPI_Comm_rank(BCL::comm, &rank);
  MPI_Comm_size(BCL::comm, &nprocs);
  BCL::my_rank = rank;
  BCL::my_nprocs = nprocs;

  MPI_Info_create(&info);
  MPI_Info_set(info, "accumulate_ordering", "none");
  MPI_Info_set(info, "accumulate_ops", "same_op_no_op");
  MPI_Info_set(info, "same_size", "true");
  MPI_Info_set(info, "same_disp_unit", "true");

  MPI_Win_allocate(BCL::shared_segment_size, 1, info, BCL::comm,
    &smem_base_ptr, &win);

  bcl_finalized = false;

  init_malloc();

  MPI_Barrier(BCL::comm);
  MPI_Win_lock_all(0, win);
  BCL::barrier();
}